

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O0

int plugin_manager_destroy_cb(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  long in_RCX;
  long in_RDX;
  plugin_manager manager;
  plugin p;
  int result;
  int local_24;
  
  local_24 = 0;
  if (in_RDX != 0) {
    if (((in_RCX != 0) && (*(long *)(in_RCX + 0x18) != 0)) && (**(long **)(in_RCX + 0x18) != 0)) {
      local_24 = (*(code *)**(undefined8 **)(in_RCX + 0x18))(in_RCX,in_RDX);
    }
    plugin_destroy((plugin)0x103812);
  }
  return local_24;
}

Assistant:

int plugin_manager_destroy_cb(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	int result = 0;

	(void)s;
	(void)key;

	if (val != NULL)
	{
		plugin p = (plugin)val;

		if (args != NULL)
		{
			plugin_manager manager = (plugin_manager)args;

			if (manager->iface != NULL && manager->iface->clear != NULL)
			{
				/* Call to the clear method of the manager */
				result = manager->iface->clear(manager, p);
			}
		}

		/* Unload the dynamic link library and destroy the plugin */
		plugin_destroy(p);
	}

	return result;
}